

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::toTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,RenderBits renderBits)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  int local_1d8;
  int infoNdx;
  bool first;
  ostringstream stream;
  anon_struct_16_2_44180aad bitInfos [4];
  RenderBits renderBits_local;
  
  bitInfos[3].str._4_4_ = (uint)this;
  memcpy(&stream.field_0x170,&DAT_032cf0d0,0x40);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&infoNdx);
  bVar1 = true;
  for (local_1d8 = 0; local_1d8 < 4; local_1d8 = local_1d8 + 1) {
    if ((bitInfos[3].str._4_4_ & *(uint *)&bitInfos[(long)local_1d8 + -1].str) != 0) {
      pcVar3 = "_";
      if (bVar1) {
        pcVar3 = "";
      }
      poVar2 = std::operator<<((ostream *)&infoNdx,pcVar3);
      std::operator<<(poVar2,*(char **)(bitInfos + local_1d8));
      bVar1 = false;
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&infoNdx);
  return __return_storage_ptr__;
}

Assistant:

string toTestName (RenderBits renderBits)
{
	struct
	{
		RenderBits	bit;
		const char*	str;
	} bitInfos[] =
	{
		{ RENDERBITS_AS_VERTEX_ARRAY,		"as_vertex_array"		},
		{ RENDERBITS_AS_INDEX_ARRAY,		"as_index_array"		},
		{ RENDERBITS_AS_VERTEX_TEXTURE,		"as_vertex_texture"		},
		{ RENDERBITS_AS_FRAGMENT_TEXTURE,	"as_fragment_texture"	}
	};

	std::ostringstream	stream;
	bool				first	= true;

	DE_ASSERT(renderBits != 0);

	for (int infoNdx = 0; infoNdx < DE_LENGTH_OF_ARRAY(bitInfos); infoNdx++)
	{
		if (renderBits & bitInfos[infoNdx].bit)
		{
			stream << (first ? "" : "_") << bitInfos[infoNdx].str;
			first = false;
		}
	}

	return stream.str();
}